

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::setEnterBound4Row(SPxSolverBase<double> *this,int i,int n)

{
  double dVar1;
  Status SVar2;
  Status *pSVar3;
  double *pdVar4;
  long in_RDI;
  int in_stack_ffffffffffffff9c;
  Desc *in_stack_ffffffffffffffa0;
  VectorBase<double> *this_00;
  
  SPxBasisBase<double>::desc((SPxBasisBase<double> *)(in_RDI + 0x1c8));
  pSVar3 = SPxBasisBase<double>::Desc::rowStatus
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  SVar2 = *pSVar3;
  if (SVar2 == P_FIXED) {
    pdVar4 = (double *)infinity();
    dVar1 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *pdVar4 = -dVar1;
    pdVar4 = (double *)infinity();
    dVar1 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *pdVar4 = dVar1;
  }
  else if (SVar2 == P_ON_LOWER) {
    pdVar4 = (double *)infinity();
    dVar1 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *pdVar4 = -dVar1;
    pdVar4 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    dVar1 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *pdVar4 = dVar1;
  }
  else if (SVar2 == P_ON_UPPER) {
    pdVar4 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    dVar1 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *pdVar4 = dVar1;
    pdVar4 = (double *)infinity();
    dVar1 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    *pdVar4 = dVar1;
  }
  else {
    pdVar4 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    this_00 = (VectorBase<double> *)*pdVar4;
    pdVar4 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff9c);
    *pdVar4 = (double)this_00;
    pdVar4 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff9c);
    dVar1 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff9c);
    *pdVar4 = dVar1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setEnterBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = theURbound[n];
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = theLRbound[n];
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   default:
      theUBbound[i] = theURbound[n];
      theLBbound[i] = theLRbound[n];
      break;
   }
}